

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

int vkt::clipping::anon_unknown_0::countPixels
              (ConstPixelBufferAccess *pixels,IVec2 *regionOffset,IVec2 *regionSize,Vec4 *color,
              Vec4 *colorThreshold)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int y;
  int z;
  int y_00;
  int iVar4;
  Vec4 maxColor;
  Vec4 minColor;
  undefined1 local_68 [16];
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  IVec2 *local_38;
  
  tcu::operator-((tcu *)&local_48,color,colorThreshold);
  tcu::operator+((tcu *)&local_58,color,colorThreshold);
  iVar1 = regionSize->m_data[0];
  iVar2 = regionOffset->m_data[0];
  z = regionOffset->m_data[1];
  iVar3 = regionSize->m_data[1] + z;
  iVar4 = 0;
  local_38 = regionOffset;
  for (; z < iVar3; z = z + 1) {
    for (y_00 = local_38->m_data[0]; y_00 < iVar1 + iVar2; y_00 = y_00 + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_68,(int)pixels,y_00,z);
      if ((((local_48 <= (float)local_68._0_4_) && ((float)local_68._0_4_ <= local_58)) &&
          (local_44 <= (float)local_68._4_4_)) &&
         ((((float)local_68._4_4_ <= local_54 && (local_40 <= (float)local_68._8_4_)) &&
          (((float)local_68._8_4_ <= local_50 && (local_3c <= (float)local_68._12_4_)))))) {
        iVar4 = (iVar4 + 1) - (uint)(local_4c < (float)local_68._12_4_);
      }
    }
  }
  return iVar4;
}

Assistant:

int countPixels (const tcu::ConstPixelBufferAccess pixels, const IVec2& regionOffset, const IVec2& regionSize, const Vec4& color, const Vec4& colorThreshold)
{
	const Vec4	minColor	= color - colorThreshold;
	const Vec4	maxColor	= color + colorThreshold;
	const int	xEnd		= regionOffset.x() + regionSize.x();
	const int	yEnd		= regionOffset.y() + regionSize.y();
	int			numPixels	= 0;

	DE_ASSERT(xEnd <= pixels.getWidth());
	DE_ASSERT(yEnd <= pixels.getHeight());

	for (int y = regionOffset.y(); y < yEnd; ++y)
	for (int x = regionOffset.x(); x < xEnd; ++x)
	{
		if (isColorInRange(pixels.getPixel(x, y), minColor, maxColor))
			++numPixels;
	}

	return numPixels;
}